

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dangical.cpp
# Opt level: O1

UBool calendar_dangi_cleanup(void)

{
  if (gDangiCalendarZoneAstroCalc != (TimeZone *)0x0) {
    (*(gDangiCalendarZoneAstroCalc->super_UObject)._vptr_UObject[1])();
    gDangiCalendarZoneAstroCalc = (TimeZone *)0x0;
  }
  LOCK();
  gDangiCalendarInitOnce.fState.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  return '\x01';
}

Assistant:

U_CDECL_BEGIN
static UBool calendar_dangi_cleanup(void) {
    if (gDangiCalendarZoneAstroCalc) {
        delete gDangiCalendarZoneAstroCalc;
        gDangiCalendarZoneAstroCalc = NULL;
    }
    gDangiCalendarInitOnce.reset();
    return TRUE;
}